

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O0

void tgt_destroy(opj_tgt_tree_t *p_tree)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      free(*(void **)((long)in_RDI + 0x10));
      *(undefined8 *)((long)in_RDI + 0x10) = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void tgt_destroy(opj_tgt_tree_t *p_tree)
{
	if (! p_tree) {
		return;
	}

	if (p_tree->nodes) {
		opj_free(p_tree->nodes);
		p_tree->nodes = 00;
	}
	opj_free(p_tree);
}